

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beatnik.hpp
# Opt level: O0

bool __thiscall
re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::process
          (beatnik<float,_1024L,_128L,_2048L,_128L> *this,span<const_float,_128L> audio)

{
  bool bVar1;
  long lVar2;
  container_type *arr;
  int_t period;
  span<const_float,_2048L> local_30;
  storage_type<gsl::details::extent_type<128L>_> local_28;
  float local_1c;
  beatnik<float,_1024L,_128L,_2048L,_128L> *pbStack_18;
  float_t sample;
  beatnik<float,_1024L,_128L,_2048L,_128L> *this_local;
  span<const_float,_128L> audio_local;
  
  local_28 = audio.storage_.data_;
  pbStack_18 = this;
  this_local = (beatnik<float,_1024L,_128L,_2048L,_128L> *)audio.storage_.data_;
  local_1c = onset_detector<float,1024l>::process<128l>((onset_detector<float,1024l> *)this,audio);
  ring_array<float,_2048UL>::push_back(&this->odf_buffer,&local_1c);
  tracker<float,_256L,_4L>::update_score(&this->tracker_,local_1c);
  lVar2 = this->counter + 1;
  this->counter = lVar2;
  if (0x7f < lVar2) {
    this->counter = 0;
    arr = ring_array<float,_2048UL>::linearize(&this->odf_buffer);
    gsl::span<float_const,2048l>::span<2048ul,float>((span<float_const,2048l> *)&local_30,arr);
    period = decoder<float,_2048L,_4L>::calculate_period(&this->decoder_,local_30);
    tracker<float,_256L,_4L>::set_period_guess(&this->tracker_,period);
  }
  bVar1 = tracker<float,_256L,_4L>::new_estimate_expected(&this->tracker_);
  return bVar1;
}

Assistant:

bool
    process(gsl::span<float_t const, fft_step> audio) noexcept
    {
        float_t sample = onset_detector_.process(audio);
        odf_buffer.push_back(sample);
        tracker_.update_score(sample);

        if (++counter >= odf_step) {
            counter = 0;
            tracker_.set_period_guess(
                decoder_.calculate_period(odf_buffer.linearize())
            );
        }

        return tracker_.new_estimate_expected();
    }